

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_format_value.cpp
# Opt level: O2

ExceptionFormatValue * __thiscall
duckdb::ExceptionFormatValue::CreateFormatValue<char*>
          (ExceptionFormatValue *__return_storage_ptr__,ExceptionFormatValue *this,char *value)

{
  allocator local_31;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(char *)this,&local_31);
  ExceptionFormatValue(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

ExceptionFormatValue ExceptionFormatValue::CreateFormatValue(char *value) {
	return ExceptionFormatValue(string(value));
}